

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

void xmlFreeTextWriterNsStackEntry(xmlLinkPtr lk)

{
  long *plVar1;
  xmlTextWriterNsStackEntry *p;
  xmlLinkPtr lk_local;
  
  plVar1 = (long *)xmlLinkGetData(lk);
  if (plVar1 != (long *)0x0) {
    if (*plVar1 != 0) {
      (*xmlFree)((void *)*plVar1);
    }
    if (plVar1[1] != 0) {
      (*xmlFree)((void *)plVar1[1]);
    }
    (*xmlFree)(plVar1);
  }
  return;
}

Assistant:

static void
xmlFreeTextWriterNsStackEntry(xmlLinkPtr lk)
{
    xmlTextWriterNsStackEntry *p;

    p = (xmlTextWriterNsStackEntry *) xmlLinkGetData(lk);
    if (p == 0)
        return;

    if (p->prefix != 0)
        xmlFree(p->prefix);
    if (p->uri != 0)
        xmlFree(p->uri);

    xmlFree(p);
}